

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O1

int __thiscall delaunator::Delaunator::link(Delaunator *this,char *__from,char *__to)

{
  pointer puVar1;
  iterator iVar2;
  char *extraout_RAX;
  runtime_error *this_00;
  char *pcVar3;
  char *local_28;
  size_t b_local;
  size_t a_local;
  
  puVar1 = (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pcVar3 = (char *)((long)iVar2._M_current - (long)puVar1 >> 3);
  local_28 = __to;
  b_local = (size_t)__from;
  if (pcVar3 == __from) {
    if (iVar2._M_current ==
        (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->halfedges,iVar2,
                 (unsigned_long *)&local_28);
    }
    else {
      *iVar2._M_current = (unsigned_long)__to;
      (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  else {
    if (pcVar3 <= __from) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Cannot link edge");
      goto LAB_0010a066;
    }
    puVar1[(long)__from] = (unsigned_long)__to;
  }
  if (local_28 != (char *)0xffffffffffffffff) {
    puVar1 = (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2._M_current =
         (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    pcVar3 = (char *)((long)iVar2._M_current - (long)puVar1 >> 3);
    if (local_28 == pcVar3) {
      if (iVar2._M_current ==
          (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->halfedges,iVar2,
                   &b_local);
        local_28 = extraout_RAX;
      }
      else {
        *iVar2._M_current = b_local;
        (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        local_28 = (char *)b_local;
      }
    }
    else {
      if (pcVar3 <= local_28) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Cannot link edge");
LAB_0010a066:
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar1[(long)local_28] = b_local;
    }
  }
  return (int)local_28;
}

Assistant:

void Delaunator::link(const std::size_t a, const std::size_t b) {
    std::size_t s = halfedges.size();
    if (a == s) {
        halfedges.push_back(b);
    } else if (a < s) {
        halfedges[a] = b;
    } else {
        throw std::runtime_error("Cannot link edge");
    }
    if (b != INVALID_INDEX) {
        std::size_t s2 = halfedges.size();
        if (b == s2) {
            halfedges.push_back(a);
        } else if (b < s2) {
            halfedges[b] = a;
        } else {
            throw std::runtime_error("Cannot link edge");
        }
    }
}